

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 int32_to_float128_aarch64(int32_t a,float_status *status)

{
  byte bVar1;
  int iVar2;
  uint32_t local_44;
  uint64_t zSig0;
  int8_t shiftCount;
  uint32_t absA;
  flag zSign;
  float_status *status_local;
  undefined1 auStack_18 [4];
  int32_t a_local;
  
  if (a == 0) {
    _auStack_18 = packFloat128('\0',0,0,0);
  }
  else {
    local_44 = a;
    if (a < 0) {
      local_44 = -a;
    }
    iVar2 = clz32(local_44);
    bVar1 = (char)iVar2 + 0x11;
    _auStack_18 = packFloat128(a < 0,0x402e - (char)bVar1,(ulong)local_44 << (bVar1 & 0x3f),0);
  }
  return _auStack_18;
}

Assistant:

float128 int32_to_float128(int32_t a, float_status *status)
{
    flag zSign;
    uint32_t absA;
    int8_t shiftCount;
    uint64_t zSig0;

    if ( a == 0 ) return packFloat128( 0, 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz32(absA) + 17;
    zSig0 = absA;
    return packFloat128( zSign, 0x402E - shiftCount, zSig0<<shiftCount, 0 );

}